

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDAttDefList.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DTDAttDefList::DTDAttDefList
          (DTDAttDefList *this,
          RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *listToUse,
          MemoryManager *manager)

{
  int iVar1;
  RefHashTableOfEnumerator<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *this_00;
  undefined4 extraout_var;
  
  (this->super_XMLAttDefList).fMemoryManager = manager;
  (this->super_XMLAttDefList).super_XSerializable._vptr_XSerializable =
       (_func_int **)&PTR__DTDAttDefList_0041aed0;
  this->fEnum = (RefHashTableOfEnumerator<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *)0x0;
  this->fList = listToUse;
  this->fArray = (DTDAttDef **)0x0;
  this->fSize = 0;
  this->fCount = 0;
  this_00 = (RefHashTableOfEnumerator<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *)
            XMemory::operator_new(0x30,manager);
  RefHashTableOfEnumerator<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher>::
  RefHashTableOfEnumerator(this_00,listToUse,false,manager);
  this->fEnum = this_00;
  iVar1 = (*manager->_vptr_MemoryManager[3])(manager,0x10);
  this->fArray = (DTDAttDef **)CONCAT44(extraout_var,iVar1);
  this->fSize = 2;
  return;
}

Assistant:

DTDAttDefList::DTDAttDefList(RefHashTableOf<DTDAttDef>* const listToUse, MemoryManager* const manager)
: XMLAttDefList(manager)
,fEnum(0)
,fList(listToUse)
,fArray(0)
,fSize(0)
,fCount(0)
{
    fEnum = new (getMemoryManager()) RefHashTableOfEnumerator<DTDAttDef>(listToUse, false, manager);
    fArray = (DTDAttDef **)(manager->allocate( sizeof(DTDAttDef*) << 1));
    fSize = 2;
}